

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

bool absl::lts_20250127::str_format_internal::anon_unknown_0::FloatToSink<double>
               (double v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char cVar3;
  anon_unknown_0 *paVar4;
  string_view data_postfix;
  uint3 uVar5;
  undefined3 uVar6;
  undefined8 uVar7;
  byte bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  FormatConversionChar FVar15;
  byte bVar16;
  size_t padding_offset;
  long lVar17;
  char *pcVar18;
  undefined1 *puVar19;
  char *pcVar20;
  byte bVar21;
  int iVar22;
  Buffer *pBVar23;
  char *pcVar24;
  _anonymous_namespace_ *this;
  ulong uVar25;
  ulong uVar26;
  anon_unknown_0 *paVar27;
  anon_unknown_0 *this_00;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  double dVar33;
  ulong in_XMM0_Qb;
  string_view value;
  Decomposed<double> decomposed;
  Decomposed<double> decomposed_00;
  uint128 v_00;
  string_view data;
  string_view str;
  char digits_buffer [20];
  Buffer buffer;
  undefined1 local_15c [36];
  FormatState local_138;
  double local_118;
  double local_108;
  ulong uStack_100;
  size_t local_f8;
  Buffer *pBStack_f0;
  Buffer local_e8;
  FormatSinkImpl *sink_00;
  
  if ((long)v < 0) {
    dVar33 = -v;
    in_XMM0_Qb = in_XMM0_Qb ^ 0x8000000000000000;
    bVar8 = 0x2d;
  }
  else {
    bVar8 = 0x2b;
    dVar33 = v;
    if ((conv->flags_ & kShowPos) == kBasic) {
      bVar8 = (conv->flags_ & kSignCol) << 3;
    }
  }
  if (bVar8 == 0) {
    pBVar23 = &local_e8;
  }
  else {
    pBVar23 = (Buffer *)(local_e8.data + 1);
    local_e8.data[0] = bVar8;
  }
  local_118 = v;
  if (NAN(dVar33)) {
    FVar15 = conv->conv_;
    pcVar18 = "NAN";
    pcVar12 = "nan";
LAB_004d7dec:
    if ((FVar15 & ~x) == F) {
      pcVar12 = pcVar18;
    }
    if (FVar15 == X) {
      pcVar12 = pcVar18;
    }
    pBVar23->data[2] = pcVar12[2];
    *(undefined2 *)pBVar23->data = *(undefined2 *)pcVar12;
    value._M_len = (char *)((long)pBVar23 + (3 - (long)&local_e8));
    value._M_str = local_e8.data;
    local_108 = dVar33;
    uStack_100 = in_XMM0_Qb;
    bVar9 = FormatSinkImpl::PutPaddedString(sink,value,conv->width_,-1,(bool)(conv->flags_ & kLeft))
    ;
    dVar33 = local_108;
    if (bVar9) {
      return true;
    }
  }
  else if (INFINITY <= dVar33) {
    FVar15 = conv->conv_;
    pcVar18 = "INF";
    pcVar12 = "inf";
    goto LAB_004d7dec;
  }
  iVar11 = 6;
  if (-1 < conv->precision_) {
    iVar11 = conv->precision_;
  }
  local_15c._0_4_ = 0;
  pBVar23 = &local_e8;
  dVar33 = frexp(dVar33,(int *)pBVar23);
  dVar33 = ldexp(dVar33,0x35);
  uVar7 = local_15c._4_8_;
  FVar15 = conv->conv_;
  if (6 < (FVar15 & 0xfffffffe) - 8) {
    return false;
  }
  uVar31 = (ulong)iVar11;
  uVar28 = local_e8.data._0_4_ - 0x35;
  sink_00 = (FormatSinkImpl *)(ulong)uVar28;
  this = (_anonymous_namespace_ *)
         ((long)(dVar33 - 9.223372036854776e+18) & (long)dVar33 >> 0x3f | (long)dVar33);
  local_138.sign_char = bVar8;
  local_138.precision = uVar31;
  local_138.conv = conv;
  local_138.sink = sink;
  switch(FVar15 & 0xfffffffe) {
  case 8:
    if ((int)local_e8.data._0_4_ < 0x35) {
      if ((int)local_e8.data._0_4_ < -0x4b) {
        FormatFNegativeExpSlow
                  ((anon_unknown_0 *)this,(uint128)(ZEXT416(0x35 - local_e8.data._0_4_) << 0x40),
                   (int)local_15c + 0x24,(FormatState *)&switchD_004d7ec4::switchdataD_0071a4e0);
        return true;
      }
    }
    else {
      if (this == (_anonymous_namespace_ *)0x0) {
        uVar10 = 0x40;
      }
      else {
        lVar17 = 0x3f;
        if (this != (_anonymous_namespace_ *)0x0) {
          for (; (ulong)this >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        uVar10 = (uint)lVar17 ^ 0x3f;
      }
      if (0x80 < (int)((local_e8.data._0_4_ - uVar10) + 0xb)) {
        FormatFPositiveExpSlow
                  ((anon_unknown_0 *)this,(uint128)(ZEXT416(uVar28) << 0x40),(int)local_15c + 0x24,
                   (FormatState *)&switchD_004d7ec4::switchdataD_0071a4e0);
        return true;
      }
    }
    pcVar12 = local_e8.data + 0x2b;
    local_e8.data[0x2a] = '.';
    pcVar24 = pcVar12;
    if ((int)local_e8.data._0_4_ < 0x35) {
      uVar25 = 0;
      if (-0xb < (int)local_e8.data._0_4_) {
        uVar25 = (ulong)this >> ((byte)(0x35 - local_e8.data._0_4_) & 0x3f);
      }
      pcVar20 = local_e8.data + 0x29;
      do {
        pcVar18 = pcVar20;
        *pcVar18 = (char)uVar25 + (char)(uVar25 / 10) * -10 | 0x30;
        pcVar20 = pcVar18 + -1;
        bVar9 = 9 < uVar25;
        uVar25 = uVar25 / 10;
      } while (bVar9);
      *pcVar20 = '0';
      if ((int)local_e8.data._0_4_ < -0xb) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pcVar12;
        pcVar24 = PrintFractionalDigitsFast
                            ((anon_unknown_0 *)this,(uint128)(auVar2 << 0x40),
                             (char *)(ulong)(0x35 - local_e8.data._0_4_),iVar11,0xcccccccccccccccd);
      }
      else {
        uVar25 = (long)this << (local_e8.data[0] + 0xbU & 0x3f);
        if (iVar11 != 0) {
          do {
            if (uVar25 == 0) goto LAB_004d8532;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = uVar25;
            uVar25 = SUB168(auVar1 * ZEXT816(10),0);
            *pcVar24 = SUB161(auVar1 * ZEXT816(10),8) | 0x30;
            pcVar24 = pcVar24 + 1;
            uVar31 = uVar31 - 1;
          } while (uVar31 != 0);
        }
        pcVar14 = pcVar24;
        if ((long)uVar25 < 0) {
          while( true ) {
            do {
              pcVar14 = pcVar14 + -1;
              bVar8 = *pcVar14;
            } while (bVar8 == 0x2e);
            if (bVar8 != 0x39) break;
            *pcVar14 = 0x30;
          }
          *pcVar14 = bVar8 + 1;
        }
      }
LAB_004d8532:
      if (*pcVar20 != '0') {
        pcVar18 = pcVar20;
      }
    }
    else {
      if (this == (_anonymous_namespace_ *)0x0) {
        uVar10 = 0x40;
      }
      else {
        lVar17 = 0x3f;
        if (this != (_anonymous_namespace_ *)0x0) {
          for (; (ulong)this >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        uVar10 = (uint)lVar17 ^ 0x3f;
      }
      pcVar18 = local_e8.data + 0x2a;
      bVar8 = (byte)uVar28;
      if ((int)((local_e8.data._0_4_ - uVar10) + 0xb) < 0x41) {
        uVar31 = (long)this << (bVar8 & 0x3f);
        do {
          pcVar18[-1] = (char)uVar31 + (char)(uVar31 / 10) * -10 | 0x30;
          pcVar18 = pcVar18 + -1;
          bVar9 = 9 < uVar31;
          uVar31 = uVar31 / 10;
        } while (bVar9);
      }
      else {
        paVar27 = (anon_unknown_0 *)((long)this << (bVar8 & 0x3f));
        this_00 = paVar27;
        paVar4 = (anon_unknown_0 *)(0L << (bVar8 & 0x3f) | (ulong)this >> 0x40 - (bVar8 & 0x3f));
        if ((uVar28 & 0x40) != 0) {
          this_00 = (anon_unknown_0 *)0x0;
          paVar4 = paVar27;
        }
        v_00.hi_ = (uint64_t)pcVar18;
        v_00.lo_ = (uint64_t)paVar4;
        pcVar18 = PrintIntegralDigitsFromRightFast(this_00,v_00,(char *)sink_00);
      }
    }
    if (local_138.precision == 0) {
      lVar17 = (long)(char)((((local_138.conv)->flags_ >> 3 & 1) != 0) + -1);
    }
    else {
      lVar17 = 0;
    }
    pcVar20 = pcVar24 + (lVar17 - (long)pcVar18);
    pcVar12 = pcVar12 + (local_138.precision - (long)pcVar24);
    local_15c._4_8_ = 0;
    local_15c._12_8_ = "";
    sVar13 = 0;
    pBVar23 = (Buffer *)0x50989c;
    padding_offset = 0;
    goto LAB_004d8598;
  case 10:
    decomposed_00._8_8_ = uVar31;
    decomposed_00.mantissa = (MantissaType)sink_00;
    bVar9 = str_format_internal::(anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
                      (this,decomposed_00,(size_t)&local_e8,(Buffer *)local_15c,(int *)sink_00);
    if (!bVar9) {
LAB_004d7f92:
      bVar9 = FallbackToSnprintf<double>(local_118,conv,sink);
      return bVar9;
    }
    if ((conv->flags_ & kAlt) == kBasic) {
      if (local_e8.end <= local_e8.begin) {
LAB_004d8452:
        __assert_fail("begin < end",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3fc,
                      "char &absl::str_format_internal::(anonymous namespace)::Buffer::back() const"
                     );
      }
      if (local_e8.end[-1] == '.') {
        local_e8.end = local_e8.end + -1;
      }
    }
    break;
  case 0xc:
    uVar25 = 1;
    if (iVar11 != 0) {
      uVar25 = uVar31;
    }
    decomposed._8_8_ = uVar25 - 1;
    decomposed.mantissa = (MantissaType)sink_00;
    bVar9 = str_format_internal::(anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
                      (this,decomposed,(size_t)&local_e8,(Buffer *)local_15c,(int *)sink_00);
    if (!bVar9) goto LAB_004d7f92;
    uVar31 = (ulong)(int)local_15c._0_4_;
    if ((long)uVar31 < 0) {
      if (-5 < (int)local_15c._0_4_) goto LAB_004d820e;
    }
    else if (uVar31 < uVar25) {
LAB_004d820e:
      if ((int)local_15c._0_4_ < 0) {
        local_e8.begin[1] = *local_e8.begin;
        if ((int)local_15c._0_4_ < -1) {
          iVar11 = local_15c._0_4_ + 1;
          do {
            pcVar12 = local_e8.begin + -1;
            *local_e8.begin = '0';
            iVar11 = iVar11 + 1;
            local_e8.begin = pcVar12;
          } while (iVar11 != 0);
        }
        *local_e8.begin = '.';
        local_e8.begin[-1] = '0';
        local_e8.begin = local_e8.begin + -1;
      }
      else if (local_15c._0_4_ != 0) {
        std::_V2::__rotate<char*>(local_e8.begin + 1,local_e8.begin + 2,local_e8.begin + uVar31 + 2)
        ;
      }
      local_15c._0_4_ = 0;
    }
    pcVar12 = local_e8.end;
    if ((conv->flags_ & kAlt) == kBasic) {
      do {
        local_e8.end = pcVar12;
        if (local_e8.end <= local_e8.begin) goto LAB_004d8452;
        pcVar12 = local_e8.end + -1;
      } while (*pcVar12 == '0');
      if (*pcVar12 == '.') {
        local_e8.end = pcVar12;
      }
    }
    if (local_15c._0_4_ == 0) goto LAB_004d84b2;
    break;
  case 0xe:
    iVar11 = conv->precision_;
    iVar22 = local_e8.data._0_4_ + 0xb;
    if (0 < (long)this) {
      iVar29 = -0x3fe;
      if (iVar22 < -0x3fe) {
        iVar29 = iVar22;
      }
      do {
        if (iVar22 < -0x3fd) {
          uVar25 = (ulong)this >> (2U - (char)iVar29 & 0x3f);
          iVar29 = -0x3fe;
          bVar8 = 0;
          goto LAB_004d7ffe;
        }
        this = (_anonymous_namespace_ *)((long)this * 2);
        iVar22 = iVar22 + -1;
      } while (0 < (long)this);
    }
    bVar8 = (byte)((ulong)this >> 0x3f);
    iVar29 = 0;
    if (this != (_anonymous_namespace_ *)0x0) {
      iVar29 = iVar22 + -1;
    }
    uVar25 = (long)this * 2;
LAB_004d7ffe:
    uVar26 = 0x10 - uVar31;
    if (0x10 < uVar31) {
      uVar26 = 0;
    }
    if (iVar11 < 0) {
      uVar26 = 0;
    }
    cVar3 = (char)uVar26;
    if (uVar26 != 0) {
      bVar21 = cVar3 * '\x04';
      uVar30 = (uVar25 << (cVar3 * -4 & 0x3fU)) >> (cVar3 * -4 & 0x3fU);
      uVar32 = 8L << (bVar21 - 4 & 0x3f);
      if (uVar30 == uVar32) {
        bVar16 = bVar8;
        if (uVar26 != 0x10) {
          bVar16 = (byte)(uVar25 >> (bVar21 & 0x3f));
        }
        bVar9 = (bool)(bVar16 & 1);
      }
      else {
        bVar9 = uVar32 < uVar30;
      }
      if (bVar9 != false) {
        lVar17 = 0;
        if (0xf >= uVar26) {
          lVar17 = 1L << (bVar21 & 0x3f);
        }
        bVar9 = (long)uVar25 < 0;
        uVar25 = uVar25 + lVar17;
        bVar8 = bVar8 + (-1 < (long)uVar25 && bVar9 || 0xf < uVar26);
      }
    }
    uVar30 = uVar25;
    if (-1 < iVar11) {
      uVar25 = uVar25 & (-(ulong)(uVar26 == 0) | ~(0xffffffffffffffffU >> (cVar3 * -4 & 0x3fU)));
      uVar30 = uVar31;
    }
    lVar17 = (ulong)(FVar15 != A) * 0x10;
    uVar5 = CONCAT12("0123456789ABCDEF0123456789abcdef"[(ulong)bVar8 + lVar17],
                     CONCAT11((FVar15 != A) << 5,0x30));
    local_15c._4_3_ = uVar5 | 0x5800;
    uVar6 = local_15c._4_3_;
    local_15c._4_8_ = CONCAT53(local_15c._7_5_,uVar5) | 0x5800;
    if ((uVar30 == 0) && ((conv->flags_ & kAlt) == kBasic)) {
      puVar19 = local_15c + 7;
    }
    else {
      puVar19 = local_15c + 8;
      local_15c._8_4_ = SUB84(uVar7,4);
      local_15c[7] = '.';
      local_15c._4_4_ = CONCAT13(local_15c[7],uVar6);
    }
    uVar26 = 0;
    if (uVar25 != 0) {
      do {
        puVar19[uVar26] = "0123456789ABCDEF0123456789abcdef"[(uVar25 >> 0x3c) + lVar17];
        uVar25 = uVar25 << 4;
        uVar26 = uVar26 + 1;
      } while (uVar25 != 0);
      puVar19 = puVar19 + uVar26;
    }
    if (iVar11 < 0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar12 = (char *)(uVar31 - uVar26);
      if (uVar31 < uVar26) {
        __assert_fail("state.precision >= digits_emitted",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3a5,
                      "void absl::str_format_internal::(anonymous namespace)::FormatA(const HexFloatTypeParams, Int, int, bool, const FormatState &) [Int = unsigned long]"
                     );
      }
    }
    pcVar18 = local_15c + 4;
    pcVar20 = puVar19 + -(long)pcVar18;
    local_e8.data._0_4_ =
         CONCAT22(local_e8.data._2_2_,CONCAT11((char)(iVar29 >> 0x1f) * -2 + '+',(FVar15 != A) << 5)
                 ) | 0x50;
    iVar11 = -iVar29;
    if (0 < iVar29) {
      iVar11 = iVar29;
    }
    numbers_internal::FastIntToBuffer(iVar11,local_e8.data + 2);
    sVar13 = strlen(pBVar23->data);
    padding_offset = 2;
    local_f8 = sVar13;
    pBStack_f0 = pBVar23;
LAB_004d8598:
    data_postfix._M_str = pBVar23->data;
    data_postfix._M_len = sVar13;
    data._M_str = pcVar18;
    data._M_len = (size_t)pcVar20;
    FinalPrint((FormatState *)(local_15c + 0x24),data,padding_offset,(size_t)pcVar12,data_postfix);
    return true;
  }
  bVar21 = 0x45;
  if (conv->conv_ != X) {
    bVar21 = ((conv->conv_ & ~x) != F) << 5 | 0x45;
  }
  PrintExponent(local_15c._0_4_,bVar21,&local_e8);
LAB_004d84b2:
  str._M_str = (char *)conv;
  str._M_len = (size_t)local_e8.begin;
  WriteBufferToSink((anon_unknown_0 *)(ulong)bVar8,(char)local_e8.end - (char)local_e8.begin,str,
                    (FormatConversionSpecImpl *)sink,sink_00);
  return true;
}

Assistant:

bool FloatToSink(const Float v, const FormatConversionSpecImpl &conv,
                 FormatSinkImpl *sink) {
  // Print the sign or the sign column.
  Float abs_v = v;
  char sign_char = 0;
  if (std::signbit(abs_v)) {
    sign_char = '-';
    abs_v = -abs_v;
  } else if (conv.has_show_pos_flag()) {
    sign_char = '+';
  } else if (conv.has_sign_col_flag()) {
    sign_char = ' ';
  }

  // Print nan/inf.
  if (ConvertNonNumericFloats(sign_char, abs_v, conv, sink)) {
    return true;
  }

  size_t precision =
      conv.precision() < 0 ? 6 : static_cast<size_t>(conv.precision());

  int exp = 0;

  auto decomposed = Decompose(abs_v);

  Buffer buffer;

  FormatConversionChar c = conv.conversion_char();

  if (c == FormatConversionCharInternal::f ||
      c == FormatConversionCharInternal::F) {
    FormatF(decomposed.mantissa, decomposed.exponent,
            {sign_char, precision, conv, sink});
    return true;
  } else if (c == FormatConversionCharInternal::e ||
             c == FormatConversionCharInternal::E) {
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if (!conv.has_alt_flag() && buffer.back() == '.') buffer.pop_back();
    PrintExponent(
        exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
        &buffer);
  } else if (c == FormatConversionCharInternal::g ||
             c == FormatConversionCharInternal::G) {
    precision = std::max(precision, size_t{1}) - 1;
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if ((exp < 0 || precision + 1 > static_cast<size_t>(exp)) && exp >= -4) {
      if (exp < 0) {
        // Have 1.23456, needs 0.00123456
        // Move the first digit
        buffer.begin[1] = *buffer.begin;
        // Add some zeros
        for (; exp < -1; ++exp) *buffer.begin-- = '0';
        *buffer.begin-- = '.';
        *buffer.begin = '0';
      } else if (exp > 0) {
        // Have 1.23456, needs 1234.56
        // Move the '.' exp positions to the right.
        std::rotate(buffer.begin + 1, buffer.begin + 2, buffer.begin + exp + 2);
      }
      exp = 0;
    }
    if (!conv.has_alt_flag()) {
      while (buffer.back() == '0') buffer.pop_back();
      if (buffer.back() == '.') buffer.pop_back();
    }
    if (exp) {
      PrintExponent(
          exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
          &buffer);
    }
  } else if (c == FormatConversionCharInternal::a ||
             c == FormatConversionCharInternal::A) {
    bool uppercase = (c == FormatConversionCharInternal::A);
    FormatA(HexFloatTypeParams(Float{}), decomposed.mantissa,
            decomposed.exponent, uppercase, {sign_char, precision, conv, sink});
    return true;
  } else {
    return false;
  }

  WriteBufferToSink(
      sign_char,
      absl::string_view(buffer.begin,
                        static_cast<size_t>(buffer.end - buffer.begin)),
      conv, sink);

  return true;
}